

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::string_maker<std::basic_string_view<char,std::char_traits<char>>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          string_maker<std::basic_string_view<char,std::char_traits<char>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *value)

{
  uint *puVar1;
  ostringstream os;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,*(char **)(this + 8),*(long *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }